

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

void __thiscall MyCompiler::RecursiveDescentParser::finish(RecursiveDescentParser *this)

{
  allocator local_31;
  string local_30 [32];
  RecursiveDescentParser *local_10;
  RecursiveDescentParser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"eof expected",&local_31);
  except(this,NUL,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void MyCompiler::RecursiveDescentParser::finish()
{
    except(SymbolType::NUL, "eof expected");
}